

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2predicates.cc
# Opt level: O0

int s2pred::SymbolicallyPerturbedSign
              (Vector3_xf *a,Vector3_xf *b,Vector3_xf *c,Vector3_xf *b_cross_c)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  bool local_2d1;
  ExactFloat local_2d0;
  ExactFloat local_2c0;
  ExactFloat local_2b0;
  ExactFloat local_2a0;
  ExactFloat local_290;
  ExactFloat local_280;
  ExactFloat local_270;
  ExactFloat local_260;
  ExactFloat local_250;
  ExactFloat local_240;
  byte local_229;
  S2LogMessage local_228;
  S2LogMessageVoidify local_211;
  ExactFloat local_210;
  ExactFloat local_200;
  ExactFloat local_1f0;
  ExactFloat local_1e0;
  ExactFloat local_1d0;
  ExactFloat local_1c0;
  ExactFloat local_1b0;
  ExactFloat local_1a0;
  ExactFloat local_190;
  ExactFloat local_180;
  ExactFloat local_170;
  ExactFloat local_160;
  ExactFloat local_150;
  ExactFloat local_140;
  ExactFloat local_130;
  ExactFloat local_120;
  ExactFloat local_110;
  ExactFloat local_100;
  ExactFloat local_f0;
  ExactFloat local_e0;
  ExactFloat local_d0;
  ExactFloat local_c0;
  ExactFloat local_b0;
  ExactFloat local_a0;
  ExactFloat local_90;
  ExactFloat local_80;
  ExactFloat local_70;
  int local_60;
  int det_sign;
  byte local_49;
  S2LogMessage local_48;
  S2LogMessageVoidify local_31;
  Vector3_xf *local_30;
  Vector3_xf *b_cross_c_local;
  Vector3_xf *c_local;
  Vector3_xf *b_local;
  Vector3_xf *a_local;
  
  local_30 = b_cross_c;
  b_cross_c_local = c;
  c_local = b;
  b_local = a;
  bVar1 = util::math::internal_vector::BasicVector<Vector3,_ExactFloat,_3UL>::operator<
                    ((BasicVector<Vector3,_ExactFloat,_3UL> *)a,b);
  local_49 = 0;
  local_2d1 = false;
  if (bVar1) {
    local_2d1 = util::math::internal_vector::BasicVector<Vector3,_ExactFloat,_3UL>::operator<
                          ((BasicVector<Vector3,_ExactFloat,_3UL> *)c_local,b_cross_c_local);
  }
  if (((local_2d1 ^ 0xffU) & 1) != 0) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_48,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2predicates.cc"
               ,0x8c,kFatal,(ostream *)&std::cerr);
    local_49 = 1;
    poVar3 = S2LogMessage::stream(&local_48);
    poVar3 = std::operator<<(poVar3,"Check failed: a < b && b < c ");
    S2LogMessageVoidify::operator&(&local_31,poVar3);
  }
  if ((local_49 & 1) != 0) {
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_48);
  }
  util::math::internal_vector::BasicVector<Vector3,_ExactFloat,_3UL>::operator[]
            ((BasicVector<Vector3,_ExactFloat,_3UL> *)&local_70,(int)local_30);
  iVar2 = ExactFloat::sgn(&local_70);
  ExactFloat::~ExactFloat(&local_70);
  a_local._4_4_ = iVar2;
  if (iVar2 == 0) {
    local_60 = iVar2;
    util::math::internal_vector::BasicVector<Vector3,_ExactFloat,_3UL>::operator[]
              ((BasicVector<Vector3,_ExactFloat,_3UL> *)&local_80,(int)local_30);
    local_60 = ExactFloat::sgn(&local_80);
    ExactFloat::~ExactFloat(&local_80);
    if (local_60 == 0) {
      util::math::internal_vector::BasicVector<Vector3,_ExactFloat,_3UL>::operator[]
                ((BasicVector<Vector3,_ExactFloat,_3UL> *)&local_90,(int)local_30);
      local_60 = ExactFloat::sgn(&local_90);
      ExactFloat::~ExactFloat(&local_90);
      if (local_60 == 0) {
        util::math::internal_vector::BasicVector<Vector3,_ExactFloat,_3UL>::operator[]
                  ((BasicVector<Vector3,_ExactFloat,_3UL> *)&local_c0,(int)b_cross_c_local);
        util::math::internal_vector::BasicVector<Vector3,_ExactFloat,_3UL>::operator[]
                  ((BasicVector<Vector3,_ExactFloat,_3UL> *)&local_d0,(int)b_local);
        ::operator*(&local_b0,&local_c0);
        util::math::internal_vector::BasicVector<Vector3,_ExactFloat,_3UL>::operator[]
                  ((BasicVector<Vector3,_ExactFloat,_3UL> *)&local_f0,(int)b_cross_c_local);
        util::math::internal_vector::BasicVector<Vector3,_ExactFloat,_3UL>::operator[]
                  ((BasicVector<Vector3,_ExactFloat,_3UL> *)&local_100,(int)b_local);
        ::operator*(&local_e0,&local_f0);
        ::operator-(&local_a0,&local_b0);
        local_60 = ExactFloat::sgn(&local_a0);
        ExactFloat::~ExactFloat(&local_a0);
        ExactFloat::~ExactFloat(&local_e0);
        ExactFloat::~ExactFloat(&local_100);
        ExactFloat::~ExactFloat(&local_f0);
        ExactFloat::~ExactFloat(&local_b0);
        ExactFloat::~ExactFloat(&local_d0);
        ExactFloat::~ExactFloat(&local_c0);
        if (local_60 == 0) {
          util::math::internal_vector::BasicVector<Vector3,_ExactFloat,_3UL>::operator[]
                    ((BasicVector<Vector3,_ExactFloat,_3UL> *)&local_110,(int)b_cross_c_local);
          local_60 = ExactFloat::sgn(&local_110);
          ExactFloat::~ExactFloat(&local_110);
          if (local_60 == 0) {
            util::math::internal_vector::BasicVector<Vector3,_ExactFloat,_3UL>::operator[]
                      ((BasicVector<Vector3,_ExactFloat,_3UL> *)&local_120,(int)b_cross_c_local);
            local_60 = ExactFloat::sgn(&local_120);
            local_60 = -local_60;
            ExactFloat::~ExactFloat(&local_120);
            if (local_60 == 0) {
              util::math::internal_vector::BasicVector<Vector3,_ExactFloat,_3UL>::operator[]
                        ((BasicVector<Vector3,_ExactFloat,_3UL> *)&local_150,(int)b_cross_c_local);
              util::math::internal_vector::BasicVector<Vector3,_ExactFloat,_3UL>::operator[]
                        ((BasicVector<Vector3,_ExactFloat,_3UL> *)&local_160,(int)b_local);
              ::operator*(&local_140,&local_150);
              util::math::internal_vector::BasicVector<Vector3,_ExactFloat,_3UL>::operator[]
                        ((BasicVector<Vector3,_ExactFloat,_3UL> *)&local_180,(int)b_cross_c_local);
              util::math::internal_vector::BasicVector<Vector3,_ExactFloat,_3UL>::operator[]
                        ((BasicVector<Vector3,_ExactFloat,_3UL> *)&local_190,(int)b_local);
              ::operator*(&local_170,&local_180);
              ::operator-(&local_130,&local_140);
              local_60 = ExactFloat::sgn(&local_130);
              ExactFloat::~ExactFloat(&local_130);
              ExactFloat::~ExactFloat(&local_170);
              ExactFloat::~ExactFloat(&local_190);
              ExactFloat::~ExactFloat(&local_180);
              ExactFloat::~ExactFloat(&local_140);
              ExactFloat::~ExactFloat(&local_160);
              ExactFloat::~ExactFloat(&local_150);
              if (local_60 == 0) {
                util::math::internal_vector::BasicVector<Vector3,_ExactFloat,_3UL>::operator[]
                          ((BasicVector<Vector3,_ExactFloat,_3UL> *)&local_1a0,(int)b_cross_c_local)
                ;
                local_60 = ExactFloat::sgn(&local_1a0);
                ExactFloat::~ExactFloat(&local_1a0);
                if (local_60 == 0) {
                  util::math::internal_vector::BasicVector<Vector3,_ExactFloat,_3UL>::operator[]
                            ((BasicVector<Vector3,_ExactFloat,_3UL> *)&local_1d0,
                             (int)b_cross_c_local);
                  local_229 = 0;
                  util::math::internal_vector::BasicVector<Vector3,_ExactFloat,_3UL>::operator[]
                            ((BasicVector<Vector3,_ExactFloat,_3UL> *)&local_1e0,(int)b_local);
                  ::operator*(&local_1c0,&local_1d0);
                  util::math::internal_vector::BasicVector<Vector3,_ExactFloat,_3UL>::operator[]
                            ((BasicVector<Vector3,_ExactFloat,_3UL> *)&local_200,
                             (int)b_cross_c_local);
                  util::math::internal_vector::BasicVector<Vector3,_ExactFloat,_3UL>::operator[]
                            ((BasicVector<Vector3,_ExactFloat,_3UL> *)&local_210,(int)b_local);
                  ::operator*(&local_1f0,&local_200);
                  ::operator-(&local_1b0,&local_1c0);
                  iVar2 = ExactFloat::sgn(&local_1b0);
                  if (iVar2 != 0) {
                    S2FatalLogMessage::S2FatalLogMessage
                              ((S2FatalLogMessage *)&local_228,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2predicates.cc"
                               ,0xd0,kFatal,(ostream *)&std::cerr);
                    local_229 = 1;
                    poVar3 = S2LogMessage::stream(&local_228);
                    poVar3 = std::operator<<(poVar3,
                                             "Check failed: (0) == ((c[1]*a[2] - c[2]*a[1]).sgn()) "
                                            );
                    S2LogMessageVoidify::operator&(&local_211,poVar3);
                  }
                  if ((local_229 & 1) != 0) {
                    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_228);
                  }
                  ExactFloat::~ExactFloat(&local_1b0);
                  ExactFloat::~ExactFloat(&local_1f0);
                  ExactFloat::~ExactFloat(&local_210);
                  ExactFloat::~ExactFloat(&local_200);
                  ExactFloat::~ExactFloat(&local_1c0);
                  ExactFloat::~ExactFloat(&local_1e0);
                  ExactFloat::~ExactFloat(&local_1d0);
                  util::math::internal_vector::BasicVector<Vector3,_ExactFloat,_3UL>::operator[]
                            ((BasicVector<Vector3,_ExactFloat,_3UL> *)&local_260,(int)b_local);
                  util::math::internal_vector::BasicVector<Vector3,_ExactFloat,_3UL>::operator[]
                            ((BasicVector<Vector3,_ExactFloat,_3UL> *)&local_270,(int)c_local);
                  ::operator*(&local_250,&local_260);
                  util::math::internal_vector::BasicVector<Vector3,_ExactFloat,_3UL>::operator[]
                            ((BasicVector<Vector3,_ExactFloat,_3UL> *)&local_290,(int)b_local);
                  util::math::internal_vector::BasicVector<Vector3,_ExactFloat,_3UL>::operator[]
                            ((BasicVector<Vector3,_ExactFloat,_3UL> *)&local_2a0,(int)c_local);
                  ::operator*(&local_280,&local_290);
                  ::operator-(&local_240,&local_250);
                  local_60 = ExactFloat::sgn(&local_240);
                  ExactFloat::~ExactFloat(&local_240);
                  ExactFloat::~ExactFloat(&local_280);
                  ExactFloat::~ExactFloat(&local_2a0);
                  ExactFloat::~ExactFloat(&local_290);
                  ExactFloat::~ExactFloat(&local_250);
                  ExactFloat::~ExactFloat(&local_270);
                  ExactFloat::~ExactFloat(&local_260);
                  if (local_60 == 0) {
                    util::math::internal_vector::BasicVector<Vector3,_ExactFloat,_3UL>::operator[]
                              ((BasicVector<Vector3,_ExactFloat,_3UL> *)&local_2b0,(int)c_local);
                    local_60 = ExactFloat::sgn(&local_2b0);
                    local_60 = -local_60;
                    ExactFloat::~ExactFloat(&local_2b0);
                    if (local_60 == 0) {
                      util::math::internal_vector::BasicVector<Vector3,_ExactFloat,_3UL>::operator[]
                                ((BasicVector<Vector3,_ExactFloat,_3UL> *)&local_2c0,(int)c_local);
                      local_60 = ExactFloat::sgn(&local_2c0);
                      ExactFloat::~ExactFloat(&local_2c0);
                      if (local_60 == 0) {
                        util::math::internal_vector::BasicVector<Vector3,_ExactFloat,_3UL>::
                        operator[]((BasicVector<Vector3,_ExactFloat,_3UL> *)&local_2d0,(int)b_local)
                        ;
                        local_60 = ExactFloat::sgn(&local_2d0);
                        ExactFloat::~ExactFloat(&local_2d0);
                        if (local_60 == 0) {
                          a_local._4_4_ = 1;
                        }
                        else {
                          a_local._4_4_ = local_60;
                        }
                      }
                      else {
                        a_local._4_4_ = local_60;
                      }
                    }
                    else {
                      a_local._4_4_ = local_60;
                    }
                  }
                  else {
                    a_local._4_4_ = local_60;
                  }
                }
                else {
                  a_local._4_4_ = local_60;
                }
              }
              else {
                a_local._4_4_ = local_60;
              }
            }
            else {
              a_local._4_4_ = local_60;
            }
          }
          else {
            a_local._4_4_ = local_60;
          }
        }
        else {
          a_local._4_4_ = local_60;
        }
      }
      else {
        a_local._4_4_ = local_60;
      }
    }
    else {
      a_local._4_4_ = local_60;
    }
  }
  return a_local._4_4_;
}

Assistant:

int SymbolicallyPerturbedSign(
    const Vector3_xf& a, const Vector3_xf& b,
    const Vector3_xf& c, const Vector3_xf& b_cross_c) {
  // This method requires that the points are sorted in lexicographically
  // increasing order.  This is because every possible S2Point has its own
  // symbolic perturbation such that if A < B then the symbolic perturbation
  // for A is much larger than the perturbation for B.
  //
  // Alternatively, we could sort the points in this method and keep track of
  // the sign of the permutation, but it is more efficient to do this before
  // converting the inputs to the multi-precision representation, and this
  // also lets us re-use the result of the cross product B x C.
  S2_DCHECK(a < b && b < c);

  // Every input coordinate x[i] is assigned a symbolic perturbation dx[i].
  // We then compute the sign of the determinant of the perturbed points,
  // i.e.
  //               | a[0]+da[0]  a[1]+da[1]  a[2]+da[2] |
  //               | b[0]+db[0]  b[1]+db[1]  b[2]+db[2] |
  //               | c[0]+dc[0]  c[1]+dc[1]  c[2]+dc[2] |
  //
  // The perturbations are chosen such that
  //
  //   da[2] > da[1] > da[0] > db[2] > db[1] > db[0] > dc[2] > dc[1] > dc[0]
  //
  // where each perturbation is so much smaller than the previous one that we
  // don't even need to consider it unless the coefficients of all previous
  // perturbations are zero.  In fact, it is so small that we don't need to
  // consider it unless the coefficient of all products of the previous
  // perturbations are zero.  For example, we don't need to consider the
  // coefficient of db[1] unless the coefficient of db[2]*da[0] is zero.
  //
  // The follow code simply enumerates the coefficients of the perturbations
  // (and products of perturbations) that appear in the determinant above, in
  // order of decreasing perturbation magnitude.  The first non-zero
  // coefficient determines the sign of the result.  The easiest way to
  // enumerate the coefficients in the correct order is to pretend that each
  // perturbation is some tiny value "eps" raised to a power of two:
  //
  // eps**    1      2      4      8     16     32     64     128    256
  //        da[2]  da[1]  da[0]  db[2]  db[1]  db[0]  dc[2]  dc[1]  dc[0]
  //
  // Essentially we can then just count in binary and test the corresponding
  // subset of perturbations at each step.  So for example, we must test the
  // coefficient of db[2]*da[0] before db[1] because eps**12 > eps**16.
  //
  // Of course, not all products of these perturbations appear in the
  // determinant above, since the determinant only contains the products of
  // elements in distinct rows and columns.  Thus we don't need to consider
  // da[2]*da[1], db[1]*da[1], etc.  Furthermore, sometimes different pairs of
  // perturbations have the same coefficient in the determinant; for example,
  // da[1]*db[0] and db[1]*da[0] have the same coefficient (c[2]).  Therefore
  // we only need to test this coefficient the first time we encounter it in
  // the binary order above (which will be db[1]*da[0]).
  //
  // The sequence of tests below also appears in Table 4-ii of the paper
  // referenced above, if you just want to look it up, with the following
  // translations: [a,b,c] -> [i,j,k] and [0,1,2] -> [1,2,3].  Also note that
  // some of the signs are different because the opposite cross product is
  // used (e.g., B x C rather than C x B).

  int det_sign = b_cross_c[2].sgn();            // da[2]
  if (det_sign != 0) return det_sign;
  det_sign = b_cross_c[1].sgn();                // da[1]
  if (det_sign != 0) return det_sign;
  det_sign = b_cross_c[0].sgn();                // da[0]
  if (det_sign != 0) return det_sign;

  det_sign = (c[0]*a[1] - c[1]*a[0]).sgn();     // db[2]
  if (det_sign != 0) return det_sign;
  det_sign = c[0].sgn();                        // db[2] * da[1]
  if (det_sign != 0) return det_sign;
  det_sign = -(c[1].sgn());                     // db[2] * da[0]
  if (det_sign != 0) return det_sign;
  det_sign = (c[2]*a[0] - c[0]*a[2]).sgn();     // db[1]
  if (det_sign != 0) return det_sign;
  det_sign = c[2].sgn();                        // db[1] * da[0]
  if (det_sign != 0) return det_sign;
  // The following test is listed in the paper, but it is redundant because
  // the previous tests guarantee that C == (0, 0, 0).
  S2_DCHECK_EQ(0, (c[1]*a[2] - c[2]*a[1]).sgn());  // db[0]

  det_sign = (a[0]*b[1] - a[1]*b[0]).sgn();     // dc[2]
  if (det_sign != 0) return det_sign;
  det_sign = -(b[0].sgn());                     // dc[2] * da[1]
  if (det_sign != 0) return det_sign;
  det_sign = b[1].sgn();                        // dc[2] * da[0]
  if (det_sign != 0) return det_sign;
  det_sign = a[0].sgn();                        // dc[2] * db[1]
  if (det_sign != 0) return det_sign;
  return 1;                                     // dc[2] * db[1] * da[0]
}